

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O3

void CorUnix::CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress
               (CPalThread *pthrCurrent,WaitingThreadsListNode *pwtlnNode)

{
  DWORD *pDVar1;
  uint uVar2;
  int iVar3;
  _ThreadWaitInfo *p_Var4;
  bool bVar5;
  long lVar6;
  
  uVar2 = pwtlnNode->dwFlags;
  if (gPID != pwtlnNode->dwProcessId) {
    fprintf(_stderr,"] %s %s:%d","MarkWaitForDelegatedObjectSignalingInProgress",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb0a);
    fprintf(_stderr,
            "Expression: gPID == pwtlnNode->dwProcessId, Description: MarkWaitForDelegatedObjectSignalingInProgress() called from the wrong process"
           );
  }
  p_Var4 = pwtlnNode->ptwiWaitInfo;
  if (((uVar2 & 1) == 0) && (p_Var4->wdWaitDomain != LocalWait)) {
    AcquireSharedSynchLock(pthrCurrent);
    bVar5 = true;
  }
  else {
    bVar5 = false;
  }
  if (p_Var4->wtWaitType != MultipleObjectsWaitAll) {
    fprintf(_stderr,"] %s %s:%d","MarkWaitForDelegatedObjectSignalingInProgress",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/synchmgr/synchmanager.cpp"
            ,0xb17);
    fprintf(_stderr,
            "Expression: MultipleObjectsWaitAll == ptwiWaitInfo->wtWaitType, Description: MarkWaitForDelegatedObjectSignalingInProgress() called on a normal (non wait-all) wait"
           );
  }
  iVar3 = p_Var4->lObjCount;
  if (0 < (long)iVar3) {
    lVar6 = 0;
    do {
      pDVar1 = &p_Var4->rgpWTLNodes[lVar6]->dwFlags;
      *pDVar1 = *pDVar1 & 0xfffffffb;
      lVar6 = lVar6 + 1;
    } while (iVar3 != lVar6);
  }
  *(byte *)&pwtlnNode->dwFlags = (byte)pwtlnNode->dwFlags | 4;
  if (bVar5) {
    ReleaseSharedSynchLock(pthrCurrent);
    return;
  }
  return;
}

Assistant:

void CPalSynchronizationManager::MarkWaitForDelegatedObjectSignalingInProgress(
        CPalThread * pthrCurrent,
        WaitingThreadsListNode * pwtlnNode)
    {
        int i, iTgtCount;
        ThreadWaitInfo * ptwiWaitInfo = NULL;
        bool fSharedSynchLock = false;
        bool fTargetObjectIsShared =
            (0 != (WTLN_FLAG_OWNER_OBJECT_IS_SHARED & pwtlnNode->dwFlags));

        VALIDATEOBJECT(pwtlnNode);

        _ASSERT_MSG(gPID == pwtlnNode->dwProcessId,
                    "MarkWaitForDelegatedObjectSignalingInProgress() called "
                    "from the wrong process");

        ptwiWaitInfo = pwtlnNode->ptwiWaitInfo;

        if (!fSharedSynchLock && !fTargetObjectIsShared &&
            LocalWait != ptwiWaitInfo->wdWaitDomain)
        {
            AcquireSharedSynchLock(pthrCurrent);
            fSharedSynchLock = true;
        }

        _ASSERT_MSG(MultipleObjectsWaitAll == ptwiWaitInfo->wtWaitType,
                    "MarkWaitForDelegatedObjectSignalingInProgress() called "
                    "on a normal (non wait-all) wait");

        // Unmark all node other than the target one
        iTgtCount = ptwiWaitInfo->lObjCount;
        for (i=0; i < iTgtCount; i++)
        {
            VALIDATEOBJECT(ptwiWaitInfo->rgpWTLNodes[i]);

            ptwiWaitInfo->rgpWTLNodes[i]->dwFlags &=
                ~WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;
        }

        // Mark the target node
        pwtlnNode->dwFlags |= WTLN_FLAG_DELEGATED_OBJECT_SIGNALING_IN_PROGRESS;

        // Done
        if (fSharedSynchLock)
        {
            ReleaseSharedSynchLock(pthrCurrent);
        }
        return;
    }